

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = (this->pathname_)._M_string_length;
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = (this->pathname_)._M_dataplus._M_p[sVar1 - 1] == '/';
  }
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,&this->pathname_,0,sVar1 - 1);
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
    Normalize(__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}